

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O1

void __thiscall maxNodeHeap::decreaseKey(maxNodeHeap *this,NodeID node,Gain gain)

{
  int pos;
  pointer pQVar1;
  mapped_type *pmVar2;
  key_type local_14;
  
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_element_index,&local_14);
  pQVar1 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pos = pQVar1[*pmVar2].m_index;
  pQVar1[*pmVar2].m_key = gain;
  (this->m_heap).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start[pos].first = gain;
  siftDown(this,pos);
  return;
}

Assistant:

inline void maxNodeHeap::decreaseKey(NodeID node, Gain gain) {
        int queue_idx = m_element_index[node];
        int heap_idx  = m_elements[queue_idx].get_index();
        m_elements[queue_idx].set_key(gain);
        m_heap[heap_idx].first = gain;
        siftDown(heap_idx);
}